

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int sasl_challenge_set_challenge(SASL_CHALLENGE_HANDLE sasl_challenge,amqp_binary challenge_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  amqp_binary value;
  AMQP_VALUE challenge_amqp_value;
  SASL_CHALLENGE_INSTANCE *sasl_challenge_instance;
  int result;
  SASL_CHALLENGE_HANDLE sasl_challenge_local;
  amqp_binary challenge_value_local;
  
  if (sasl_challenge == (SASL_CHALLENGE_HANDLE)0x0) {
    sasl_challenge_instance._4_4_ = 0x2bcf;
  }
  else {
    value._12_4_ = 0;
    value.bytes = (void *)SUB128(challenge_value._0_12_,0);
    value.length = SUB124(challenge_value._0_12_,8);
    item_value = amqpvalue_create_binary(value);
    if (item_value == (AMQP_VALUE)0x0) {
      sasl_challenge_instance._4_4_ = 0x2bd7;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(sasl_challenge->composite_value,0,item_value);
      if (iVar1 == 0) {
        sasl_challenge_instance._4_4_ = 0;
      }
      else {
        sasl_challenge_instance._4_4_ = 0x2bdd;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return sasl_challenge_instance._4_4_;
}

Assistant:

int sasl_challenge_set_challenge(SASL_CHALLENGE_HANDLE sasl_challenge, amqp_binary challenge_value)
{
    int result;

    if (sasl_challenge == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        SASL_CHALLENGE_INSTANCE* sasl_challenge_instance = (SASL_CHALLENGE_INSTANCE*)sasl_challenge;
        AMQP_VALUE challenge_amqp_value = amqpvalue_create_binary(challenge_value);
        if (challenge_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(sasl_challenge_instance->composite_value, 0, challenge_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(challenge_amqp_value);
        }
    }

    return result;
}